

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISceneNode.h
# Opt level: O2

void __thiscall irr::scene::ISceneNode::removeAll(ISceneNode *this)

{
  long *plVar1;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *this_00;
  _List_node_base *p_Var2;
  
  this_00 = &this->Children;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)this_00) {
    *(undefined8 *)((long)p_Var2[1]._M_next + 0xc0) = 0;
    plVar1 = (long *)p_Var2[1]._M_next;
    if ((char)plVar1[0x17] == '\x01') {
      *(undefined1 *)(plVar1 + 0x17) = 0;
    }
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
  }
  ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::clear
            (this_00);
  return;
}

Assistant:

virtual void removeAll()
	{
		for (auto &child : Children) {
			child->Parent = nullptr;
			child->ThisIterator = std::nullopt;
			child->drop();
		}
		Children.clear();
	}